

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UText * charIterTextClone(UText *dest,UText *src,UBool deep,UErrorCode *status)

{
  UBool UVar1;
  CharacterIterator *ci;
  int64_t index;
  int64_t ix;
  CharacterIterator *srcCI;
  UErrorCode *status_local;
  UBool deep_local;
  UText *src_local;
  UText *dest_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (deep == '\0') {
      ci = (CharacterIterator *)(**(code **)(*src->context + 0x40))();
      dest_local = utext_openCharacterIterator_63(dest,ci,status);
      UVar1 = U_FAILURE(*status);
      if (UVar1 == '\0') {
        index = utext_getNativeIndex_63(src);
        utext_setNativeIndex_63(dest_local,index);
        dest_local->r = ci;
      }
    }
    else {
      *status = U_UNSUPPORTED_ERROR;
      dest_local = (UText *)0x0;
    }
  }
  else {
    dest_local = (UText *)0x0;
  }
  return dest_local;
}

Assistant:

static UText * U_CALLCONV
charIterTextClone(UText *dest, const UText *src, UBool deep, UErrorCode * status) {
    if (U_FAILURE(*status)) {
        return NULL;
    }

    if (deep) {
        // There is no CharacterIterator API for cloning the underlying text storage.
        *status = U_UNSUPPORTED_ERROR;
        return NULL;
    } else {
        CharacterIterator *srcCI =(CharacterIterator *)src->context;
        srcCI = srcCI->clone();
        dest = utext_openCharacterIterator(dest, srcCI, status);
        if (U_FAILURE(*status)) {
            return dest;
        }
        // cast off const on getNativeIndex.
        //   For CharacterIterator based UTexts, this is safe, the operation is const.
        int64_t  ix = utext_getNativeIndex((UText *)src);
        utext_setNativeIndex(dest, ix);
        dest->r = srcCI;    // flags that this UText owns the CharacterIterator
    }
    return dest;
}